

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

void __thiscall DiceRoller::DiceRoller(DiceRoller *this)

{
  int *piVar1;
  vector<int,_std::allocator<int>_> *this_00;
  value_type local_18;
  int local_14;
  DiceRoller *pDStack_10;
  int x;
  DiceRoller *this_local;
  
  pDStack_10 = this;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  this->diceRolled = piVar1;
  this_00 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  std::vector<int,_std::allocator<int>_>::vector(this_00);
  this->history = this_00;
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    local_18 = 0;
    std::vector<int,_std::allocator<int>_>::push_back(this->history,&local_18);
  }
  return;
}

Assistant:

DiceRoller::DiceRoller() : diceRolled(new int(0)), history(new std::vector<int>) {
    for (int x = 0; x < 6; x++) {
        history->push_back(0);
    }
}